

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall
stringToUnits_measurementTypes_Test::TestBody(stringToUnits_measurementTypes_Test *this)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  double in_XMM0_Qa;
  double __x;
  double in_XMM1_Qa;
  AssertHelper local_f0;
  Message local_e8;
  allocator local_d9;
  string local_d8;
  precise_unit local_b8;
  unit local_a8;
  unit local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [3];
  allocator local_61;
  string local_60;
  precise_unit local_40;
  unit local_30;
  unit local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  stringToUnits_measurementTypes_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  units::unit::pow((unit *)&units::m,in_XMM0_Qa,in_XMM1_Qa);
  local_28 = units::unit::operator*((unit *)&units::pu,&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"pu*area",&local_61);
  uVar2 = units::getDefaultFlags();
  local_40 = units::unit_from_string(&local_60,uVar2);
  testing::internal::EqHelper::Compare<units::unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_20,"pu * m.pow(2)","unit_from_string(\"pu*area\")",&local_28,
             &local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x213,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  units::unit::pow((unit *)&units::m,__x,in_XMM1_Qa);
  local_a0 = units::unit::operator*((unit *)&units::percent,&local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"percent*Area",&local_d9);
  uVar2 = units::getDefaultFlags();
  local_b8 = units::unit_from_string(&local_d8,uVar2);
  testing::internal::EqHelper::Compare<units::unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_98,"percent * m.pow(2)","unit_from_string(\"percent*Area\")",
             &local_a0,&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x214,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  return;
}

Assistant:

TEST(stringToUnits, measurementTypes)
{
    EXPECT_EQ(pu * m.pow(2), unit_from_string("pu*area"));
    EXPECT_EQ(percent * m.pow(2), unit_from_string("percent*Area"));
}